

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O0

void __thiscall vec3<unsigned_int>::normalize(vec3<unsigned_int> *this)

{
  vec3_base *in_RDI;
  double dVar1;
  float fVar2;
  float in_stack_ffffffffffffffec;
  float _a;
  
  if ((((in_RDI->r != 2.1474836e+09) || (NAN(in_RDI->r))) || (in_RDI->g != 2.1474836e+09)) ||
     (((NAN(in_RDI->g) || (in_RDI->b != 2.1474836e+09)) || (NAN(in_RDI->b))))) {
    fVar2 = in_RDI->r / 4.2949673e+09;
    in_RDI->r = fVar2 + fVar2 + -1.0;
    fVar2 = in_RDI->g / 4.2949673e+09;
    in_RDI->g = fVar2 + fVar2 + -1.0;
    fVar2 = in_RDI->b / 4.2949673e+09;
    in_RDI->b = fVar2 + fVar2 + -1.0;
    fVar2 = 1.0;
    vec3_base::clamp(in_RDI,in_stack_ffffffffffffffec,1.0);
    vec3_base::base_normalize(in_RDI);
    _a = 0.5;
    dVar1 = std::floor((double)(ulong)(uint)((in_RDI->r + fVar2) * 4.2949673e+09 * 0.5 + 0.5));
    in_RDI->r = SUB84(dVar1,0);
    dVar1 = std::floor((double)(ulong)(uint)((in_RDI->g + fVar2) * 4.2949673e+09 * _a + _a));
    in_RDI->g = SUB84(dVar1,0);
    dVar1 = std::floor((double)(ulong)(uint)((in_RDI->b + fVar2) * 4.2949673e+09 * _a + _a));
    in_RDI->b = SUB84(dVar1,0);
    vec3_base::clamp(in_RDI,_a,fVar2);
  }
  return;
}

Assistant:

void normalize() {
        // Zero normals in range [-1, 1] can't be normalized
        if (gc_m[i] == r && gc_m[i] == g && gc_m[i] == b) {
            return;
        } else {
            r = (float)(r / (double)gc_s[i]) * 2.0f - 1.0f;
            g = (float)(g / (double)gc_s[i]) * 2.0f - 1.0f;
            b = (float)(b / (double)gc_s[i]) * 2.0f - 1.0f;
            clamp(-1.0f, 1.0f);
            base_normalize();
            r = (std::floor((r + 1.0f) * (float)gc_s[i] * 0.5f + 0.5f));
            g = (std::floor((g + 1.0f) * (float)gc_s[i] * 0.5f + 0.5f));
            b = (std::floor((b + 1.0f) * (float)gc_s[i] * 0.5f + 0.5f));
            clamp(0.0f, (float)gc_s[i]);
        }
    }